

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O1

bool __thiscall
re2::NFA::Search(NFA *this,StringPiece *text,StringPiece *const_context,bool anchored,bool longest,
                StringPiece *submatch,int nsubmatch)

{
  size_t __n;
  bool bVar1;
  uint uVar2;
  int iVar3;
  Inst *pIVar4;
  char **ppcVar5;
  long lVar6;
  long lVar7;
  const_pointer pcVar8;
  uint uVar9;
  char **ppcVar10;
  Thread *pTVar11;
  IndexValue *pIVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  byte *p;
  size_t sVar16;
  byte bVar17;
  byte *pbVar18;
  Threadq *runq;
  Threadq *nextq;
  bool bVar19;
  StringPiece context;
  StringPiece local_1d8;
  Threadq *local_1c8;
  StringPiece *local_1c0;
  StringPiece *local_1b8;
  LogMessage local_1b0;
  
  if (this->start_ == 0) {
    return (bool)'\0';
  }
  local_1d8.data_ = const_context->data_;
  local_1d8.size_ = const_context->size_;
  if ((byte *)local_1d8.data_ == (byte *)0x0) {
    local_1d8.data_ = text->data_;
    local_1d8.size_ = text->size_;
  }
  pcVar8 = local_1d8.data_;
  p = (byte *)text->data_;
  if (local_1d8.data_ <= p) {
    pbVar18 = p + text->size_;
    if (pbVar18 <= local_1d8.data_ + local_1d8.size_) {
      bVar19 = this->prog_->anchor_start_;
      if (((byte *)local_1d8.data_ != p & bVar19) != 0) {
        return (bool)'\0';
      }
      bVar1 = this->prog_->anchor_end_;
      if (((byte *)(local_1d8.data_ + local_1d8.size_) != pbVar18 & bVar1) != 0) {
        return (bool)'\0';
      }
      if (bVar1 != false) {
        this->endmatch_ = true;
        longest = true;
      }
      if (-1 < nsubmatch) {
        this->ncapture_ = nsubmatch * 2;
        this->longest_ = longest;
        if (nsubmatch == 0) {
          this->ncapture_ = 2;
        }
        bVar17 = bVar19 | anchored;
        __n = (long)this->ncapture_ * 8;
        sVar16 = __n;
        if ((long)this->ncapture_ < 0) {
          sVar16 = 0xffffffffffffffff;
        }
        local_1c0 = submatch;
        local_1b8 = text;
        ppcVar10 = (char **)operator_new__(sVar16);
        this->match_ = ppcVar10;
        this->matched_ = false;
        this->btext_ = pcVar8;
        this->etext_ = (char *)pbVar18;
        (this->q0_).size_ = 0;
        (this->q1_).size_ = 0;
        memset(ppcVar10,0,__n);
        runq = &this->q0_;
        local_1c8 = &this->q1_;
        do {
          nextq = local_1c8;
          uVar9 = 0xffffffff;
          if (p < this->etext_) {
            uVar9 = (uint)*p;
          }
          local_1c8 = runq;
          uVar9 = Step(this,runq,nextq,uVar9,&local_1d8,(char *)p);
          runq->size_ = 0;
          pbVar18 = (byte *)this->etext_;
          if (uVar9 == 0) {
            if (pbVar18 < p) {
              bVar19 = false;
            }
            else {
              if ((this->matched_ == false) && ((bVar17 & p != (byte *)local_1b8->data_) == 0)) {
                uVar9 = Prog::first_byte(this->prog_);
                if ((bVar17 == 0) &&
                   ((((-1 < (int)uVar9 && (nextq->size_ == 0)) &&
                     (pbVar18 = (byte *)this->etext_, p < pbVar18)) &&
                    ((uVar9 != *p &&
                     (p = (byte *)memchr(p,uVar9,(long)pbVar18 - (long)p), p == (byte *)0x0)))))) {
                  p = pbVar18;
                }
                pTVar11 = this->free_threads_;
                if (pTVar11 == (Thread *)0x0) {
                  pTVar11 = (Thread *)operator_new(0x10);
                  (pTVar11->field_0).ref = 1;
                  uVar14 = (long)this->ncapture_ * 8;
                  if ((long)this->ncapture_ < 0) {
                    uVar14 = 0xffffffffffffffff;
                  }
                  ppcVar10 = (char **)operator_new__(uVar14);
                  pTVar11->capture = ppcVar10;
                }
                else {
                  this->free_threads_ = (Thread *)pTVar11->field_0;
                  (pTVar11->field_0).ref = 1;
                }
                iVar3 = this->ncapture_;
                if (0 < (long)iVar3) {
                  ppcVar10 = pTVar11->capture;
                  ppcVar5 = this->match_;
                  uVar14 = 0;
                  do {
                    ppcVar10[uVar14] = ppcVar5[uVar14];
                    ppcVar10[uVar14 + 1] = ppcVar5[uVar14 + 1];
                    uVar14 = uVar14 + 2;
                  } while (uVar14 < (ulong)(long)iVar3);
                }
                *pTVar11->capture = (char *)p;
                uVar9 = 0xffffffff;
                if (p < this->etext_) {
                  uVar9 = (uint)*p;
                }
                AddToThreadq(this,nextq,this->start_,uVar9,&local_1d8,(char *)p,pTVar11);
                iVar3 = (pTVar11->field_0).ref;
                (pTVar11->field_0).ref = iVar3 + -1;
                if (iVar3 < 2) {
                  pTVar11->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
                  this->free_threads_ = pTVar11;
                }
              }
              bVar19 = nextq->size_ != 0;
            }
          }
          else {
            do {
              pIVar4 = ((_Head_base<0UL,_re2::Prog::Inst_*,_false> *)
                       ((long)&(this->prog_->inst_).ptr_._M_t.
                               super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                               ._M_t.
                               super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                       + 8))->_M_head_impl;
              uVar2 = pIVar4[(int)uVar9].out_opcode_;
              uVar13 = uVar2 & 7;
              if (uVar13 == 3) {
                if (pIVar4[(int)uVar9].field_1.cap_ < this->ncapture_) {
                  this->match_[pIVar4[(int)uVar9].field_1.cap_] = (char *)pbVar18;
                }
LAB_001cb2d5:
                uVar9 = uVar2 >> 4;
                bVar19 = true;
              }
              else if (uVar13 == 5) {
                this->match_[1] = (char *)pbVar18;
                this->matched_ = true;
                bVar19 = false;
              }
              else {
                if (uVar13 == 6) goto LAB_001cb2d5;
                LogMessage::LogMessage
                          (&local_1b0,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/nfa.cc"
                           ,0x21c);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1b0.str_,"Unexpected opcode in short circuit: ",0x24);
                std::ostream::operator<<
                          ((ostream *)&local_1b0.str_,pIVar4[(int)uVar9].out_opcode_ & 7);
                LogMessage::~LogMessage(&local_1b0);
                bVar19 = false;
              }
            } while (bVar19);
            bVar19 = false;
            p = pbVar18;
          }
          p = p + 1;
          runq = nextq;
          if (!bVar19) {
            if (nextq->size_ != 0) {
              pIVar12 = (nextq->dense_).ptr_._M_t.
                        super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                        .
                        super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>
                        ._M_head_impl;
              do {
                pTVar11 = pIVar12->value_;
                if ((pTVar11 != (Thread *)0x0) &&
                   (iVar3 = (pTVar11->field_0).ref, (pTVar11->field_0).ref = iVar3 + -1, iVar3 < 2))
                {
                  pTVar11->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
                  this->free_threads_ = pTVar11;
                }
                pIVar12 = pIVar12 + 1;
              } while (pIVar12 !=
                       (nextq->dense_).ptr_._M_t.
                       super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                       .
                       super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>
                       ._M_head_impl + nextq->size_);
            }
            bVar19 = this->matched_;
            if (nsubmatch != 0 && bVar19 == true) {
              uVar14 = 1;
              if (1 < nsubmatch) {
                uVar14 = (ulong)(uint)nsubmatch;
              }
              lVar15 = 0;
              do {
                lVar6 = *(long *)((long)this->match_ + lVar15);
                lVar7 = *(long *)((long)this->match_ + lVar15 + 8);
                *(long *)((long)&local_1c0->data_ + lVar15) = lVar6;
                *(long *)((long)&local_1c0->size_ + lVar15) = lVar7 - lVar6;
                lVar15 = lVar15 + 0x10;
              } while (uVar14 * 0x10 != lVar15);
              return bVar19;
            }
            return bVar19;
          }
        } while( true );
      }
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/nfa.cc"
                 ,0x1d7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0.str_,"Bad args: nsubmatch=",0x14);
      std::ostream::operator<<((ostream *)&local_1b0.str_,nsubmatch);
      goto LAB_001cb0f3;
    }
  }
  LogMessage::LogMessage
            (&local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/nfa.cc"
             ,0x1c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1b0.str_,"context does not contain text",0x1d);
LAB_001cb0f3:
  LogMessage::~LogMessage(&local_1b0);
  return false;
}

Assistant:

bool NFA::Search(const StringPiece& text, const StringPiece& const_context,
            bool anchored, bool longest,
            StringPiece* submatch, int nsubmatch) {
  if (start_ == 0)
    return false;

  StringPiece context = const_context;
  if (context.data() == NULL)
    context = text;

  // Sanity check: make sure that text lies within context.
  if (text.begin() < context.begin() || text.end() > context.end()) {
    LOG(DFATAL) << "context does not contain text";
    return false;
  }

  if (prog_->anchor_start() && context.begin() != text.begin())
    return false;
  if (prog_->anchor_end() && context.end() != text.end())
    return false;
  anchored |= prog_->anchor_start();
  if (prog_->anchor_end()) {
    longest = true;
    endmatch_ = true;
  }

  if (nsubmatch < 0) {
    LOG(DFATAL) << "Bad args: nsubmatch=" << nsubmatch;
    return false;
  }

  // Save search parameters.
  ncapture_ = 2*nsubmatch;
  longest_ = longest;

  if (nsubmatch == 0) {
    // We need to maintain match[0], both to distinguish the
    // longest match (if longest is true) and also to tell
    // whether we've seen any matches at all.
    ncapture_ = 2;
  }

  match_ = new const char*[ncapture_];
  matched_ = false;

  // For debugging prints.
  btext_ = context.data();
  // For convenience.
  etext_ = text.data() + text.size();

  if (ExtraDebug)
    fprintf(stderr, "NFA::Search %s (context: %s) anchored=%d longest=%d\n",
            std::string(text).c_str(), std::string(context).c_str(), anchored,
            longest);

  // Set up search.
  Threadq* runq = &q0_;
  Threadq* nextq = &q1_;
  runq->clear();
  nextq->clear();
  memset(&match_[0], 0, ncapture_*sizeof match_[0]);

  // Loop over the text, stepping the machine.
  for (const char* p = text.data();; p++) {
    if (ExtraDebug) {
      int c = 0;
      if (p == btext_)
        c = '^';
      else if (p > etext_)
        c = '$';
      else if (p < etext_)
        c = p[0] & 0xFF;

      fprintf(stderr, "%c:", c);
      for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i) {
        Thread* t = i->value();
        if (t == NULL)
          continue;
        fprintf(stderr, " %d%s", i->index(), FormatCapture(t->capture).c_str());
      }
      fprintf(stderr, "\n");
    }

    // This is a no-op the first time around the loop because runq is empty.
    int id = Step(runq, nextq, p < etext_ ? p[0] & 0xFF : -1, context, p);
    DCHECK_EQ(runq->size(), 0);
    using std::swap;
    swap(nextq, runq);
    nextq->clear();
    if (id != 0) {
      // We're done: full match ahead.
      p = etext_;
      for (;;) {
        Prog::Inst* ip = prog_->inst(id);
        switch (ip->opcode()) {
          default:
            LOG(DFATAL) << "Unexpected opcode in short circuit: " << ip->opcode();
            break;

          case kInstCapture:
            if (ip->cap() < ncapture_)
              match_[ip->cap()] = p;
            id = ip->out();
            continue;

          case kInstNop:
            id = ip->out();
            continue;

          case kInstMatch:
            match_[1] = p;
            matched_ = true;
            break;
        }
        break;
      }
      break;
    }

    if (p > etext_)
      break;

    // Start a new thread if there have not been any matches.
    // (No point in starting a new thread if there have been
    // matches, since it would be to the right of the match
    // we already found.)
    if (!matched_ && (!anchored || p == text.data())) {
      // If there's a required first byte for an unanchored search
      // and we're not in the middle of any possible matches,
      // use memchr to search for the byte quickly.
      int fb = prog_->first_byte();
      if (!anchored && runq->size() == 0 &&
          fb >= 0 && p < etext_ && (p[0] & 0xFF) != fb) {
        p = reinterpret_cast<const char*>(memchr(p, fb, etext_ - p));
        if (p == NULL) {
          p = etext_;
        }
      }

      Thread* t = AllocThread();
      CopyCapture(t->capture, match_);
      t->capture[0] = p;
      AddToThreadq(runq, start_, p < etext_ ? p[0] & 0xFF : -1, context, p,
                   t);
      Decref(t);
    }

    // If all the threads have died, stop early.
    if (runq->size() == 0) {
      if (ExtraDebug)
        fprintf(stderr, "dead\n");
      break;
    }
  }

  for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i)
    Decref(i->value());

  if (matched_) {
    for (int i = 0; i < nsubmatch; i++)
      submatch[i] =
          StringPiece(match_[2 * i],
                      static_cast<size_t>(match_[2 * i + 1] - match_[2 * i]));
    if (ExtraDebug)
      fprintf(stderr, "match (%td,%td)\n",
              match_[0] - btext_, match_[1] - btext_);
    return true;
  }
  return false;
}